

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiMessage.cpp
# Opt level: O1

void __thiscall
smf::MidiMessage::makeSysExMessage
          (MidiMessage *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *data)

{
  pointer *ppuVar1;
  pointer puVar2;
  pointer puVar3;
  iterator iVar4;
  ulong uVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  uchar *puVar9;
  ulong uVar10;
  uchar item;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vlv;
  uchar local_4d;
  uint local_4c;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  
  puVar2 = (data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar3 = (data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  iVar6 = (int)puVar3 - (int)puVar2;
  uVar7 = 0;
  if (puVar3 != puVar2) {
    uVar7 = (uint)(*puVar2 == 0xf0);
  }
  iVar8 = iVar6 + -1;
  if ((puVar3 != puVar2) && (puVar3[-1] == 0xf7)) {
    iVar8 = iVar6 + -2;
  }
  puVar3 = (this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar3) {
    (this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar3;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
            (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,
             (size_type)
             ((data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_finish + (7 - (long)puVar2)));
  local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ = 0xf0;
  iVar4._M_current =
       (this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar4._M_current ==
      (this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_realloc_insert<unsigned_char>
              (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,iVar4,
               (uchar *)&local_48);
  }
  else {
    *iVar4._M_current = 0xf0;
    ppuVar1 = &(this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppuVar1 = *ppuVar1 + 1;
  }
  local_4c = uVar7;
  intToVlv(&local_48,(iVar8 - uVar7) + 2);
  puVar9 = (uchar *)CONCAT71(local_48.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start._1_7_,
                             local_48.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start._0_1_);
  if (puVar9 != local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish) {
    do {
      local_4d = *puVar9;
      iVar4._M_current =
           (this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar4._M_current ==
          (this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        _M_realloc_insert<unsigned_char_const&>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)this,iVar4,&local_4d);
      }
      else {
        *iVar4._M_current = local_4d;
        ppuVar1 = &(this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppuVar1 = *ppuVar1 + 1;
      }
      puVar9 = puVar9 + 1;
    } while (puVar9 != local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
  }
  if ((int)local_4c <= iVar8) {
    uVar10 = (ulong)local_4c;
    do {
      puVar2 = (data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar5 = (long)(data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_finish - (long)puVar2;
      if (uVar5 <= uVar10) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                   uVar10,uVar5);
      }
      puVar9 = puVar2 + uVar10;
      iVar4._M_current =
           (this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar4._M_current ==
          (this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        _M_realloc_insert<unsigned_char_const&>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)this,iVar4,puVar9);
      }
      else {
        *iVar4._M_current = *puVar9;
        ppuVar1 = &(this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppuVar1 = *ppuVar1 + 1;
      }
      uVar10 = uVar10 + 1;
    } while (iVar8 + 1 != uVar10);
  }
  local_4d = 0xf7;
  iVar4._M_current =
       (this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar4._M_current ==
      (this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_realloc_insert<unsigned_char>
              (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,iVar4,&local_4d);
  }
  else {
    *iVar4._M_current = 0xf7;
    ppuVar1 = &(this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppuVar1 = *ppuVar1 + 1;
  }
  if ((void *)CONCAT71(local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start._1_7_,
                       local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start._0_1_) != (void *)0x0) {
    operator_delete((void *)CONCAT71(local_48.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                     local_48.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start._0_1_));
  }
  return;
}

Assistant:

void MidiMessage::makeSysExMessage(const std::vector<uchar>& data) {
	int startindex = 0;
	int endindex = (int)data.size() - 1;
	if (data.size() > 0) {
		if (data[0] == 0xf0) {
			startindex++;
		}
	}
	if (data.size() > 0) {
		if (data.back() == 0xf7) {
			endindex--;
		}
	}

	this->clear();
	this->reserve(data.size() + 7);

	this->push_back((uchar)0xf0);

	int msize = endindex - startindex + 2;
	std::vector<uchar> vlv = intToVlv(msize);
	for (uchar item : vlv) {
		this->push_back(item);
	}
	for (int i=startindex; i<=endindex; i++) {
		this->push_back(data.at(i));
	}
	this->push_back((uchar)0xf7);
}